

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

textblock * effect_describe(effect *e,char *prefix,int dev_skill_boost,_Bool only_first)

{
  random_value value_00;
  random_value value_01;
  random_value value_02;
  random_value value_03;
  bool bVar1;
  char *pcVar2;
  textblock *tba;
  obj_property *poVar3;
  char *pcVar4;
  char *local_2a8;
  int local_29c;
  int local_27c;
  uint local_26c;
  char *local_248;
  char *local_230;
  textblock *local_228;
  char *local_220;
  char local_208 [4];
  int i_radius;
  char dist [32];
  char local_1d8 [4];
  int stat;
  char turn_dice_string [20];
  char *fed;
  char min_string [50];
  textblock *tbe;
  effect *nexte;
  char dice_string [20];
  int local_14c;
  int roll;
  char *edesc;
  undefined1 auStack_138 [7];
  _Bool value_set;
  random_value value;
  char desc [250];
  int nadded;
  textblock *tb;
  _Bool only_first_local;
  int dev_skill_boost_local;
  char *prefix_local;
  effect *e_local;
  
  stack0xffffffffffffffd8 = (textblock *)0x0;
  desc[0xf4] = '\0';
  desc[0xf5] = '\0';
  desc[0xf6] = '\0';
  desc[0xf7] = '\0';
  memset(auStack_138,0,0x10);
  bVar1 = false;
  prefix_local = (char *)e;
  while( true ) {
    while( true ) {
      while( true ) {
        if (prefix_local == (char *)0x0) {
          return stack0xffffffffffffffd8;
        }
        pcVar2 = effect_desc((effect *)prefix_local);
        local_14c = 0;
        if (*(short *)(prefix_local + 8) != 0x6e) break;
        if (!bVar1) {
          __assert_fail("value_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                        ,0x14f,
                        "textblock *effect_describe(const struct effect *, const char *, int, _Bool)"
                       );
        }
        bVar1 = false;
        prefix_local = *(char **)prefix_local;
      }
      if (*(short *)(prefix_local + 8) == 0x6d) break;
      if ((*(long *)(prefix_local + 0x10) != 0) && (!bVar1)) {
        local_14c = dice_roll(*(dice_t **)(prefix_local + 0x10),(random_value *)auStack_138);
      }
      if ((*(short *)(prefix_local + 8) == 1) || (*(short *)(prefix_local + 8) == 0x6c)) {
        local_220 = prefix;
        if (desc._244_4_ != 0) {
          local_220 = (char *)0x0;
        }
        pcVar2 = (char *)0x0;
        if (*(short *)(prefix_local + 8) == 1) {
          pcVar2 = "randomly ";
        }
        tba = create_nested_effect_description
                        (*(effect **)prefix_local,local_14c,local_220,pcVar2,dev_skill_boost,
                         (effect **)&tbe);
        if (only_first) {
          local_228 = (textblock *)0x0;
        }
        else {
          local_228 = tbe;
        }
        prefix_local = (char *)local_228;
        if (tba != (textblock *)0x0) {
          if (stack0xffffffffffffffd8 != (textblock *)0x0) {
            pcVar2 = " and ";
            if (local_228 != (textblock *)0x0) {
              pcVar2 = ", ";
            }
            textblock_append(stack0xffffffffffffffd8,pcVar2);
            textblock_append_textblock(stack0xffffffffffffffd8,tba);
            textblock_free(tba);
            tba = stack0xffffffffffffffd8;
          }
          stack0xffffffffffffffd8 = tba;
          desc._244_4_ = desc._244_4_ + 1;
        }
      }
      else if (pcVar2 == (char *)0x0) {
        if (only_first) {
          local_230 = (char *)0x0;
        }
        else {
          local_230 = *(char **)prefix_local;
        }
        prefix_local = local_230;
      }
      else {
        format_dice_string((random_value *)auStack_138,1,0x14,(char *)&nexte);
        switch(base_descs[*(ushort *)(prefix_local + 8)].efinfo_flag) {
        case 0:
          strnfmt((char *)&value.sides,0xfa,"%s",pcVar2);
          break;
        case 1:
          strnfmt((char *)&value.sides,0xfa,pcVar2,&nexte);
          break;
        case 2:
          if (value.dice == 0) {
            strnfmt((char *)&fed,0x32,"%s","");
          }
          else {
            strnfmt((char *)&fed,0x32," (or %d%%, whichever is greater)",(ulong)(uint)value.dice);
          }
          strnfmt((char *)&value.sides,0xfa,pcVar2,&nexte,&fed);
          break;
        case 3:
          strnfmt((char *)&value.sides,0xfa,pcVar2,(long)(int)auStack_138._0_4_ / 2 & 0xffffffff);
          break;
        case 4:
          if (*(int *)(prefix_local + 0x20) == 0) {
            local_248 = "feeds you";
          }
          else {
            local_248 = "leaves you nourished";
            if (*(int *)(prefix_local + 0x20) == 1) {
              local_248 = "uses enough food value";
            }
          }
          stack0xfffffffffffffe40 = local_248;
          format_dice_string((random_value *)auStack_138,(uint)z_info->food_value,0x14,local_1d8);
          strnfmt((char *)&value.sides,0xfa,pcVar2,stack0xfffffffffffffe40,local_1d8,&nexte);
          break;
        case 5:
          strnfmt((char *)&value.sides,0xfa,pcVar2,timed_effects[*(int *)(prefix_local + 0x20)].desc
                 );
          break;
        case 6:
          strnfmt((char *)&value.sides,0xfa,pcVar2,timed_effects[*(int *)(prefix_local + 0x20)].desc
                  ,&nexte);
          break;
        case 7:
          poVar3 = lookup_obj_property(1,*(int *)(prefix_local + 0x20));
          strnfmt((char *)&value.sides,0xfa,pcVar2,poVar3->name);
          break;
        case 8:
          strnfmt((char *)&value.sides,0xfa,pcVar2,projections[*(int *)(prefix_local + 0x20)].desc);
          break;
        case 9:
          pcVar4 = summon_desc(*(wchar_t *)(prefix_local + 0x20));
          strnfmt((char *)&value.sides,0xfa,pcVar2,pcVar4);
          break;
        case 10:
          if (value.dice == 0) {
            strnfmt(local_208,0x20,"%d grids",(ulong)(uint)auStack_138._0_4_);
          }
          else {
            strnfmt(local_208,0x20,"a level-dependent distance");
          }
          pcVar4 = "you";
          if (*(int *)(prefix_local + 0x20) != 0) {
            pcVar4 = "a monster";
          }
          strnfmt((char *)&value.sides,0xfa,pcVar2,pcVar4,local_208);
          break;
        case 0xb:
          strnfmt((char *)&value.sides,0xfa,pcVar2,(ulong)*(uint *)(prefix_local + 0x24));
          break;
        case 0xc:
          strnfmt((char *)&value.sides,0xfa,pcVar2,
                  projections[*(int *)(prefix_local + 0x20)].player_desc,
                  (ulong)*(uint *)(prefix_local + 0x24),&nexte);
          value_00.dice = stack0xfffffffffffffecc;
          value_00.sides = value.base;
          value_00.base = auStack_138._0_4_;
          value_00.m_bonus = value.dice;
          append_damage((char *)&value.sides,0xfa,value_00,dev_skill_boost);
          break;
        case 0xd:
          if (*(int *)(prefix_local + 0x28) == 0) {
            local_26c = *(uint *)(prefix_local + 0x24);
          }
          else {
            local_26c = *(uint *)(prefix_local + 0x28);
          }
          strnfmt((char *)&value.sides,0xfa,pcVar2,
                  projections[*(int *)(prefix_local + 0x20)].player_desc,
                  (ulong)*(uint *)(prefix_local + 0x24),(ulong)local_26c,&nexte);
          value_01.dice = stack0xfffffffffffffecc;
          value_01.sides = value.base;
          value_01.base = auStack_138._0_4_;
          value_01.m_bonus = value.dice;
          append_damage((char *)&value.sides,0xfa,value_01,dev_skill_boost);
          break;
        case 0xe:
          strnfmt((char *)&value.sides,0xfa,pcVar2,
                  projections[*(int *)(prefix_local + 0x20)].player_desc,
                  (ulong)*(uint *)(prefix_local + 0x28),&nexte);
          local_27c = dev_skill_boost;
          if (*(short *)(prefix_local + 8) == 0x48) {
            local_27c = 0;
          }
          value_02.dice = stack0xfffffffffffffecc;
          value_02.sides = value.base;
          value_02.base = auStack_138._0_4_;
          value_02.m_bonus = value.dice;
          append_damage((char *)&value.sides,0xfa,value_02,local_27c);
          break;
        case 0xf:
          if (*(int *)(prefix_local + 0x28) == 0) {
            local_29c = 0;
          }
          else {
            local_29c = (int)player->lev / *(int *)(prefix_local + 0x28);
          }
          strnfmt((char *)&value.sides,0xfa,pcVar2,
                  projections[*(int *)(prefix_local + 0x20)].player_desc,
                  (ulong)(uint)(*(int *)(prefix_local + 0x24) + local_29c),&nexte);
          break;
        case 0x10:
          strnfmt((char *)&value.sides,0xfa,pcVar2,
                  projections[*(int *)(prefix_local + 0x20)].lash_desc,
                  (ulong)*(uint *)(prefix_local + 0x20));
          break;
        case 0x11:
          strnfmt((char *)&value.sides,0xfa,pcVar2,projections[*(int *)(prefix_local + 0x20)].desc);
          break;
        case 0x12:
          strnfmt((char *)&value.sides,0xfa,pcVar2,projections[*(int *)(prefix_local + 0x20)].desc,
                  &nexte);
          value_03.dice = stack0xfffffffffffffecc;
          value_03.sides = value.base;
          value_03.base = auStack_138._0_4_;
          value_03.m_bonus = value.dice;
          append_damage((char *)&value.sides,0xfa,value_03,dev_skill_boost);
          break;
        case 0x13:
          strnfmt((char *)&value.sides,0xfa,pcVar2,projections[*(int *)(prefix_local + 0x20)].desc);
          break;
        default:
          strnfmt((char *)&value.sides,0xfa,"%s","");
          msg("Bad effect description passed to effect_info().  Please report this bug.");
        }
        if (only_first) {
          local_2a8 = (char *)0x0;
        }
        else {
          local_2a8 = *(char **)prefix_local;
        }
        prefix_local = local_2a8;
        if ((char)value.sides != '\0') {
          if (stack0xffffffffffffffd8 == (textblock *)0x0) {
            register0x00000000 = textblock_new();
            if (prefix != (char *)0x0) {
              textblock_append(register0x00000000,"%s",prefix);
            }
          }
          else if (local_2a8 == (char *)0x0) {
            textblock_append(stack0xffffffffffffffd8," and ");
          }
          else {
            textblock_append(stack0xffffffffffffffd8,", ");
          }
          copy_to_textblock_with_coloring(stack0xffffffffffffffd8,(char *)&value.sides);
          desc._244_4_ = desc._244_4_ + 1;
        }
      }
    }
    if (*(long *)(prefix_local + 0x10) == 0) break;
    dice_roll(*(dice_t **)(prefix_local + 0x10),(random_value *)auStack_138);
    bVar1 = true;
    prefix_local = *(char **)prefix_local;
  }
  __assert_fail("e->dice != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effects-info.c"
                ,0x157,"textblock *effect_describe(const struct effect *, const char *, int, _Bool)"
               );
}

Assistant:

textblock *effect_describe(const struct effect *e, const char *prefix,
	int dev_skill_boost, bool only_first)
{
	textblock *tb = NULL;
	int nadded = 0;
	char desc[250];
	random_value value = { 0, 0, 0, 0 };
	bool value_set = false;

	while (e) {
		const char* edesc = effect_desc(e);
		int roll = 0;
		char dice_string[20];

		/* Deal with special clear value effect. */
		if (e->index == EF_CLEAR_VALUE) {
			assert(value_set);
			value_set = false;
			e = e->next;
			continue;
		}

		/* Deal with special set value effect. */
		if (e->index == EF_SET_VALUE) {
			assert(e->dice != NULL);
			roll = dice_roll(e->dice, &value);
			value_set = true;
			e = e->next;
			continue;
		}

		if ((e->dice != NULL) && !value_set) {
			roll = dice_roll(e->dice, &value);
		}

		/* Deal with special random or select effects. */
		if (e->index == EF_RANDOM || e->index == EF_SELECT) {
			const struct effect *nexte;
			textblock *tbe = create_nested_effect_description(
				e->next, roll, (nadded == 0) ? prefix : NULL,
				(e->index == EF_RANDOM) ? "randomly " : NULL,
				dev_skill_boost, &nexte);

			e = (only_first) ? NULL : nexte;
			if (tbe) {
				if (tb) {
					textblock_append(tb,
						e ? ", " : " and ");
					textblock_append_textblock(tb, tbe);
					textblock_free(tbe);
				} else {
					tb = tbe;
				}
				++nadded;
			}
			continue;
		}

		if (!edesc) {
			e = (only_first) ? NULL : e->next;
			continue;
		}

		format_dice_string(&value, 1, sizeof(dice_string), dice_string);

		/* Check all the possible types of description format. */
		switch (base_descs[e->index].efinfo_flag) {
		case EFINFO_DICE:
			strnfmt(desc, sizeof(desc), edesc, dice_string);
			break;

		case EFINFO_HEAL:
			/* Healing sometimes has a minimum percentage. */
			{
				char min_string[50];

				if (value.m_bonus) {
					strnfmt(min_string, sizeof(min_string),
						" (or %d%%, whichever is greater)",
						value.m_bonus);
				} else {
					strnfmt(min_string, sizeof(min_string),
						"%s", "");
				}
				strnfmt(desc, sizeof(desc), edesc, dice_string,
					min_string);
			}
			break;

		case EFINFO_CONST:
			strnfmt(desc, sizeof(desc), edesc, value.base / 2);
			break;

		case EFINFO_FOOD:
			{
				const char *fed = e->subtype ?
					(e->subtype == 1 ? "uses enough food value" : 
					 "leaves you nourished") : "feeds you";
				char turn_dice_string[20];

				format_dice_string(&value, z_info->food_value,
					sizeof(turn_dice_string),
					turn_dice_string);

				strnfmt(desc, sizeof(desc), edesc, fed,
					turn_dice_string, dice_string);
			}
			break;

		case EFINFO_CURE:
			strnfmt(desc, sizeof(desc), edesc,
				timed_effects[e->subtype].desc);
			break;

		case EFINFO_TIMED:
			strnfmt(desc, sizeof(desc), edesc,
				timed_effects[e->subtype].desc,
				dice_string);
			break;

		case EFINFO_STAT:
			{
				int stat = e->subtype;

				strnfmt(desc, sizeof(desc), edesc,
					lookup_obj_property(OBJ_PROPERTY_STAT, stat)->name);
			}
			break;

		case EFINFO_SEEN:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_SUMM:
			strnfmt(desc, sizeof(desc), edesc,
				summon_desc(e->subtype));
			break;

		case EFINFO_TELE:
			/*
			 * Only currently used for the player, but can handle
			 * monsters.
			 */
			{
				char dist[32];

				if (value.m_bonus) {
					strnfmt(dist, sizeof(dist),
						"a level-dependent distance");
				} else {
					strnfmt(dist, sizeof(dist),
						"%d grids", value.base);
				}
				strnfmt(desc, sizeof(desc), edesc,
					(e->subtype) ? "a monster" : "you",
					dist);
			}
			break;

		case EFINFO_QUAKE:
			strnfmt(desc, sizeof(desc), edesc, e->radius);
			break;

		case EFINFO_BALL:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc,
				e->radius, dice_string);
			append_damage(desc, sizeof(desc), value, dev_skill_boost);
			break;

		case EFINFO_SPOT:
			{
				int i_radius = e->other ? e->other : e->radius;

				strnfmt(desc, sizeof(desc), edesc,
					projections[e->subtype].player_desc,
					e->radius, i_radius, dice_string);
				append_damage(desc, sizeof(desc), value, dev_skill_boost);
			}
			break;

		case EFINFO_BREATH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc, e->other,
				dice_string);
			append_damage(desc, sizeof(desc), value,
				e->index == EF_BREATH ? 0 : dev_skill_boost);
			break;

		case EFINFO_SHORT:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].player_desc,
				e->radius +
					(e->other ? player->lev / e->other : 0),
				dice_string);
			break;

		case EFINFO_LASH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].lash_desc, e->subtype);
			break;

		case EFINFO_BOLT:
			/* Bolt that inflict status */
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_BOLTD:
			/* Bolts and beams that damage */
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc, dice_string);
			append_damage(desc, sizeof(desc), value, dev_skill_boost);
			break;

		case EFINFO_TOUCH:
			strnfmt(desc, sizeof(desc), edesc,
				projections[e->subtype].desc);
			break;

		case EFINFO_NONE:
			strnfmt(desc, sizeof(desc), "%s", edesc);
			break;

		default:
			strnfmt(desc, sizeof(desc), "%s", "");
			msg("Bad effect description passed to effect_info().  Please report this bug.");
			break;
		}

		e = (only_first) ? NULL : e->next;

		if (desc[0] != '\0') {
			if (tb) {
				if (e) {
					textblock_append(tb, ", ");
				} else {
					textblock_append(tb, " and ");
				}
			} else {
				tb = textblock_new();
				if (prefix) {
					textblock_append(tb, "%s", prefix);
				}
			}
			copy_to_textblock_with_coloring(tb, desc);

			++nadded;
		}
	}

	return tb;
}